

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::composer<double,_1,_10,_12>::compose0(double *dst,double *p,double *c)

{
  composer<double,_1,_8,_12>::compose0(dst,p,c + 2);
  dst[9] = 0.0;
  taylor_inplace_multiplier<double,_1,_9,_9,_0>::mul(dst,p);
  *dst = c[1];
  dst[10] = 0.0;
  taylor_inplace_multiplier<double,_1,_10,_10,_0>::mul(dst,p);
  *dst = *c;
  return;
}

Assistant:

static void compose0(numtype dst[], const numtype p[], const numtype c[]) {
    composer<numtype, Nvar, Ndeg - 1, Ndegp>::compose0(dst, p, c + 1);
    // Zero top of dst
    for (int i = polylen<Nvar, Ndeg - 1>::len; i < polylen<Nvar, Ndeg>::len; i++)
      dst[i] = 0;
    // We now have R in dst, multiply by p and add c[0]
    taylor_inplace_multiplier < numtype, Nvar, Ndeg,
        Ndeg<Ndegp ? Ndeg : Ndegp, 0>::mul(dst, p);
    dst[0] = c[0];
  }